

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> __thiscall
flow::lang::Parser::resolve
          (Parser *this,
          list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *callables,
          ParamList *params)

{
  _List_node_base *p_Var1;
  bool bVar2;
  const_reference ppCVar3;
  reference ppCVar4;
  size_type sVar5;
  SourceLocation *pSVar6;
  reference ppCVar7;
  NativeCallback *pNVar8;
  Signature *pSVar9;
  pointer in_RCX;
  Signature local_228;
  allocator<char> local_1e1;
  string local_1e0;
  CallableSym *local_1c0;
  CallableSym *callableSym;
  string local_1b0;
  reference local_190;
  pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *me;
  iterator __end3;
  iterator __begin3;
  list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  string msg;
  CallableSym *callee_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *__range2_1;
  list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  matchErrors;
  list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> result;
  CallableSym *local_88;
  CallableSym *callee;
  const_iterator __end2;
  const_iterator __begin2;
  list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *__range2;
  Signature inputSignature;
  ParamList *params_local;
  list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *callables_local;
  Parser *this_local;
  
  inputSignature.args_.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_RCX;
  ppCVar3 = std::__cxx11::
            list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::front
                      ((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                        *)params);
  makeSignature((Signature *)&__range2,*ppCVar3,
                (ParamList *)
                inputSignature.args_.
                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  __end2 = std::__cxx11::list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
           ::begin((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                   params);
  callee = (CallableSym *)
           std::__cxx11::list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
           ::end((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                 params);
  do {
    bVar2 = std::operator!=(&__end2,(_Self *)&callee);
    if (!bVar2) {
      std::__cxx11::list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::
      list((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
           &matchErrors.
            super__List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl._M_node._M_size);
      std::__cxx11::
      list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::list((list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range2_1);
      __end2_1 = std::__cxx11::
                 list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::begin
                           ((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                             *)params);
      callee_1 = (CallableSym *)
                 std::__cxx11::
                 list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::end
                           ((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                             *)params);
      while (bVar2 = std::operator!=(&__end2_1,(_Self *)&callee_1), bVar2) {
        ppCVar4 = std::_List_const_iterator<flow::lang::CallableSym_*>::operator*(&__end2_1);
        msg.field_2._8_8_ = *ppCVar4;
        std::__cxx11::string::string((string *)local_108);
        bVar2 = CallableSym::tryMatch
                          ((CallableSym *)msg.field_2._8_8_,
                           (ParamList *)
                           inputSignature.args_.
                           super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_108);
        if (bVar2) {
          std::__cxx11::list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
          ::push_back((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *
                      )&matchErrors.
                        super__List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl._M_node._M_size,(value_type *)((long)&msg.field_2 + 8));
        }
        else {
          std::__cxx11::
          list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
          ::emplace_back<flow::lang::CallableSym*&,std::__cxx11::string&>
                    ((list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
                      *)&__range2_1,(CallableSym **)((long)&msg.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
          ;
        }
        std::__cxx11::string::~string((string *)local_108);
        std::_List_const_iterator<flow::lang::CallableSym_*>::operator++(&__end2_1);
      }
      bVar2 = std::__cxx11::
              list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::empty
                        ((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                          *)&matchErrors.
                             super__List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl._M_node._M_size);
      if (bVar2) {
        p_Var1 = callables[4].
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        pSVar6 = lastLocation((Parser *)callables);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"No matching signature for {}.",&local_129);
        Signature::Signature((Signature *)&__range3,(Signature *)&__range2);
        diagnostics::Report::typeError<flow::Signature>
                  ((Report *)p_Var1,pSVar6,&local_128,(Signature *)&__range3);
        Signature::~Signature((Signature *)&__range3);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        __end3 = std::__cxx11::
                 list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2_1);
        me = (pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::__cxx11::
                list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&__range2_1);
        while (bVar2 = std::operator!=(&__end3,(_Self *)&me), bVar2) {
          local_190 = std::
                      _List_iterator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator*(&__end3);
          p_Var1 = callables[4].
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
          pSVar6 = lastLocation((Parser *)callables);
          diagnostics::Report::typeError<>((Report *)p_Var1,pSVar6,&local_190->second);
          std::
          _List_iterator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&__end3);
        }
        std::unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>>::
        unique_ptr<std::default_delete<flow::lang::CallExpr>,void>
                  ((unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>> *)
                   this,(nullptr_t)0x0);
      }
      else {
        sVar5 = std::__cxx11::
                list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::size
                          ((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                            *)&matchErrors.
                               super__List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl._M_node._M_size);
        if (sVar5 < 2) {
          ppCVar7 = std::__cxx11::
                    list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::
                    front((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                           *)&matchErrors.
                              super__List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl._M_node._M_size);
          local_1c0 = *ppCVar7;
          pNVar8 = CallableSym::nativeCallback(local_1c0);
          bVar2 = NativeCallback::isExperimental(pNVar8);
          if (bVar2) {
            p_Var1 = callables[4].
                     super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                     ._M_impl._M_node.super__List_node_base._M_prev;
            pSVar6 = lastLocation((Parser *)callables);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1e0,"Using experimental builtin API {}.",&local_1e1);
            pNVar8 = CallableSym::nativeCallback(local_1c0);
            pSVar9 = NativeCallback::signature(pNVar8);
            Signature::Signature(&local_228,pSVar9);
            diagnostics::Report::warning<flow::Signature>
                      ((Report *)p_Var1,pSVar6,&local_1e0,&local_228);
            Signature::~Signature(&local_228);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::allocator<char>::~allocator(&local_1e1);
          }
          pSVar6 = ASTNode::location((ASTNode *)local_1c0);
          std::
          make_unique<flow::lang::CallExpr,flow::SourceLocation&,flow::lang::CallableSym*&,flow::lang::ParamList>
                    ((SourceLocation *)this,(CallableSym **)pSVar6,(ParamList *)&local_1c0);
        }
        else {
          p_Var1 = callables[4].
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
          pSVar6 = lastLocation((Parser *)callables);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Call to builtin is ambiguous.",
                     (allocator<char> *)((long)&callableSym + 7));
          diagnostics::Report::typeError<>((Report *)p_Var1,pSVar6,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&callableSym + 7));
          std::unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>>::
          unique_ptr<std::default_delete<flow::lang::CallExpr>,void>
                    ((unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>> *)
                     this,(nullptr_t)0x0);
        }
      }
      std::__cxx11::
      list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~list((list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range2_1);
      std::__cxx11::list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::
      ~list((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
            &matchErrors.
             super__List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl._M_node._M_size);
LAB_00153553:
      Signature::~Signature((Signature *)&__range2);
      return (__uniq_ptr_data<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>,_true,_true>
              )(__uniq_ptr_data<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>,_true,_true>
                )this;
    }
    ppCVar4 = std::_List_const_iterator<flow::lang::CallableSym_*>::operator*(&__end2);
    local_88 = *ppCVar4;
    bVar2 = CallableSym::isDirectMatch
                      (local_88,(ParamList *)
                                inputSignature.args_.
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      pSVar6 = ASTNode::location((ASTNode *)local_88);
      std::
      make_unique<flow::lang::CallExpr,flow::SourceLocation&,flow::lang::CallableSym*&,flow::lang::ParamList>
                ((SourceLocation *)this,(CallableSym **)pSVar6,(ParamList *)&local_88);
      goto LAB_00153553;
    }
    std::_List_const_iterator<flow::lang::CallableSym_*>::operator++(&__end2);
  } while( true );
}

Assistant:

std::unique_ptr<CallExpr> Parser::resolve(
    const std::list<CallableSym*>& callables, ParamList&& params) {
  Signature inputSignature = makeSignature(callables.front(), params);

  // attempt to find a full match first
  for (CallableSym* callee : callables) {
    if (callee->isDirectMatch(params)) {
      return std::make_unique<CallExpr>(callee->location(), callee,
                                        std::move(params));
    }
  }

  // attempt to find something with default values or parameter-reordering (if
  // named args)
  std::list<CallableSym*> result;
  std::list<std::pair<CallableSym*, std::string>> matchErrors;

  for (CallableSym* callee : callables) {
    std::string msg;
    if (callee->tryMatch(params, &msg)) {
      result.push_back(callee);
    } else {
      matchErrors.emplace_back(callee, msg);
    }
  }

  if (result.empty()) {
    report_.typeError(lastLocation(), "No matching signature for {}.", inputSignature);
    for (const auto& me : matchErrors) {
      report_.typeError(lastLocation(), me.second);
    }
    return nullptr;
  }

  if (result.size() > 1) {
    report_.typeError(lastLocation(), "Call to builtin is ambiguous.");
    return nullptr;
  }

  CallableSym* callableSym = result.front();

  if (callableSym->nativeCallback()->isExperimental()) {
    report_.warning(lastLocation(),
                    "Using experimental builtin API {}.",
                    callableSym->nativeCallback()->signature());
  }

  return std::make_unique<CallExpr>(callableSym->location(), callableSym,
                                    std::move(params));
}